

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O2

void print<std::queue<int,std::__cxx11::list<int,std::allocator<int>>>>
               (queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> *t,char *s)

{
  ostream *poVar1;
  
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  while ((t->c).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
         _M_next != (_List_node_base *)t) {
    poVar1 = std::operator<<((ostream *)&std::cout,' ');
    std::ostream::operator<<
              (poVar1,*(int *)&(t->c).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                               super__List_node_base._M_next[1]._M_next);
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front(&t->c);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.front();
		t.pop();
	}
	std::cout << std::endl;
}